

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

int xar_read_data_skip(archive_read *a)

{
  long *plVar1;
  int iVar2;
  int64_t iVar3;
  
  plVar1 = (long *)a->format->data;
  iVar2 = 1;
  if ((int)plVar1[3] == 0) {
    iVar3 = __archive_read_consume(a,plVar1[0x3d] + plVar1[0x3c]);
    if (iVar3 < 0) {
      iVar2 = -0x1e;
    }
    else {
      *plVar1 = *plVar1 + iVar3;
      plVar1[0x3d] = 0;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
xar_read_data_skip(struct archive_read *a)
{
	struct xar *xar;
	int64_t bytes_skipped;

	xar = (struct xar *)(a->format->data);
	if (xar->end_of_file)
		return (ARCHIVE_EOF);
	bytes_skipped = __archive_read_consume(a, xar->entry_remaining +
		xar->entry_unconsumed);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);
	xar->offset += bytes_skipped;
	xar->entry_unconsumed = 0;
	return (ARCHIVE_OK);
}